

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathtypes.h
# Opt level: O2

mat4 * __thiscall rengine::mat4::operator*(mat4 *__return_storage_ptr__,mat4 *this,mat4 o)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  uint uVar17;
  float fVar18;
  
  uVar17 = this->type;
  if (o.type == 1 && uVar17 == 1) {
    fVar1 = this->m[3];
    fVar2 = this->m[7];
    __return_storage_ptr__->m[0] = 1.0;
    __return_storage_ptr__->m[1] = 0.0;
    __return_storage_ptr__->m[2] = 0.0;
    __return_storage_ptr__->m[3] = fVar1 + o.m[3];
    __return_storage_ptr__->m[4] = 0.0;
    __return_storage_ptr__->m[5] = 1.0;
    __return_storage_ptr__->m[6] = 0.0;
    __return_storage_ptr__->m[7] = fVar2 + o.m[7];
    __return_storage_ptr__->m[8] = 0.0;
    __return_storage_ptr__->m[9] = 0.0;
    __return_storage_ptr__->m[10] = 1.0;
    __return_storage_ptr__->m[0xb] = 0.0;
    __return_storage_ptr__->m[0xc] = 0.0;
    __return_storage_ptr__->m[0xd] = 0.0;
    __return_storage_ptr__->m[0xe] = 0.0;
    __return_storage_ptr__->m[0xf] = 1.0;
    uVar17 = 1;
  }
  else if (uVar17 == 1) {
    fVar1 = this->m[3];
    fVar2 = this->m[7];
    uVar17 = o.type | 1;
    __return_storage_ptr__->m[0] = fVar1 * o.m[0xc] + o.m[0];
    __return_storage_ptr__->m[1] = fVar1 * o.m[0xd] + o.m[1];
    __return_storage_ptr__->m[2] = fVar1 * o.m[0xe] + o.m[2];
    __return_storage_ptr__->m[3] = fVar1 * o.m[0xf] + o.m[3];
    __return_storage_ptr__->m[4] = fVar2 * o.m[0xc] + o.m[4];
    __return_storage_ptr__->m[5] = fVar2 * o.m[0xd] + o.m[5];
    __return_storage_ptr__->m[6] = fVar2 * o.m[0xe] + o.m[6];
    __return_storage_ptr__->m[7] = fVar2 * o.m[0xf] + o.m[7];
    *(long *)(__return_storage_ptr__->m + 8) = o.m._32_8_;
    *(long *)(__return_storage_ptr__->m + 10) = o.m._40_8_;
    __return_storage_ptr__->m[0xc] = o.m[0xc];
    __return_storage_ptr__->m[0xd] = o.m[0xd];
    __return_storage_ptr__->m[0xe] = o.m[0xe];
    __return_storage_ptr__->m[0xf] = o.m[0xf];
  }
  else if (o.type == 1) {
    fVar1 = this->m[0];
    fVar2 = this->m[1];
    fVar18 = this->m[2];
    fVar3 = this->m[3];
    fVar4 = this->m[4];
    fVar5 = this->m[5];
    fVar6 = this->m[6];
    fVar7 = this->m[7];
    fVar8 = this->m[8];
    fVar9 = this->m[9];
    fVar10 = this->m[10];
    fVar11 = this->m[0xb];
    fVar12 = this->m[0xc];
    fVar13 = this->m[0xd];
    fVar14 = this->m[0xe];
    fVar15 = this->m[0xf];
    __return_storage_ptr__->m[0] = fVar1;
    __return_storage_ptr__->m[1] = fVar2;
    __return_storage_ptr__->m[2] = fVar18;
    __return_storage_ptr__->m[3] = fVar1 * o.m[3] + fVar2 * o.m[7] + fVar3;
    __return_storage_ptr__->m[4] = fVar4;
    __return_storage_ptr__->m[5] = fVar5;
    __return_storage_ptr__->m[6] = fVar6;
    __return_storage_ptr__->m[7] = fVar4 * o.m[3] + o.m[7] * fVar5 + fVar7;
    __return_storage_ptr__->m[8] = fVar8;
    __return_storage_ptr__->m[9] = fVar9;
    __return_storage_ptr__->m[10] = fVar10;
    __return_storage_ptr__->m[0xb] = fVar8 * o.m[3] + o.m[7] * fVar9 + fVar11;
    __return_storage_ptr__->m[0xc] = fVar12;
    __return_storage_ptr__->m[0xd] = fVar13;
    __return_storage_ptr__->m[0xe] = fVar14;
    __return_storage_ptr__->m[0xf] = o.m[3] * fVar12 + o.m[7] * fVar13 + fVar15;
    uVar17 = uVar17 | 1;
  }
  else {
    fVar1 = this->m[0];
    fVar2 = this->m[1];
    fVar18 = fVar1 * o.m[0] + fVar2 * o.m[4];
    if (o.type < 8 && uVar17 < 8) {
      fVar3 = this->m[3];
      fVar4 = this->m[4];
      fVar5 = this->m[5];
      fVar6 = this->m[7];
      __return_storage_ptr__->m[0] = fVar18;
      __return_storage_ptr__->m[1] = fVar1 * o.m[1] + fVar2 * o.m[5];
      __return_storage_ptr__->m[2] = 0.0;
      uVar17 = o.type | uVar17;
      __return_storage_ptr__->m[3] = fVar1 * o.m[3] + fVar2 * o.m[7] + fVar3;
      __return_storage_ptr__->m[4] = o.m[0] * fVar4 + o.m[4] * fVar5;
      __return_storage_ptr__->m[5] = o.m[1] * fVar4 + o.m[5] * fVar5;
      __return_storage_ptr__->m[6] = 0.0;
      __return_storage_ptr__->m[7] = fVar4 * o.m[3] + o.m[7] * fVar5 + fVar6;
      __return_storage_ptr__->m[8] = 0.0;
      __return_storage_ptr__->m[9] = 0.0;
      __return_storage_ptr__->m[10] = 1.0;
      __return_storage_ptr__->m[0xb] = 0.0;
      __return_storage_ptr__->m[0xc] = 0.0;
      __return_storage_ptr__->m[0xd] = 0.0;
      __return_storage_ptr__->m[0xe] = 0.0;
      __return_storage_ptr__->m[0xf] = 1.0;
    }
    else {
      fVar3 = this->m[2];
      fVar4 = this->m[3];
      fVar5 = this->m[5];
      fVar6 = this->m[4];
      fVar7 = this->m[6];
      fVar8 = this->m[7];
      fVar9 = this->m[9];
      fVar10 = this->m[8];
      fVar11 = this->m[10];
      fVar12 = this->m[0xb];
      fVar13 = this->m[0xd];
      fVar14 = this->m[0xc];
      fVar15 = this->m[0xe];
      fVar16 = this->m[0xf];
      __return_storage_ptr__->m[0] = fVar4 * o.m[0xc] + fVar3 * o.m[8] + fVar18;
      __return_storage_ptr__->m[1] =
           fVar4 * o.m[0xd] + fVar3 * o.m[9] + fVar1 * o.m[1] + fVar2 * o.m[5];
      __return_storage_ptr__->m[2] =
           fVar4 * o.m[0xe] + fVar3 * o.m[10] + fVar1 * o.m[2] + fVar2 * o.m[6];
      __return_storage_ptr__->m[3] =
           fVar4 * o.m[0xf] + fVar3 * o.m[0xb] + fVar1 * o.m[3] + fVar2 * o.m[7];
      __return_storage_ptr__->m[4] =
           fVar8 * o.m[0xc] + fVar7 * o.m[8] + fVar6 * o.m[0] + o.m[4] * fVar5;
      __return_storage_ptr__->m[5] =
           fVar8 * o.m[0xd] + fVar7 * o.m[9] + fVar6 * o.m[1] + o.m[5] * fVar5;
      __return_storage_ptr__->m[6] =
           fVar8 * o.m[0xe] + fVar7 * o.m[10] + fVar6 * o.m[2] + o.m[6] * fVar5;
      __return_storage_ptr__->m[7] =
           fVar8 * o.m[0xf] + fVar7 * o.m[0xb] + fVar6 * o.m[3] + fVar5 * o.m[7];
      __return_storage_ptr__->m[8] =
           fVar12 * o.m[0xc] + fVar11 * o.m[8] + fVar10 * o.m[0] + o.m[4] * fVar9;
      __return_storage_ptr__->m[9] =
           fVar12 * o.m[0xd] + fVar11 * o.m[9] + fVar10 * o.m[1] + o.m[5] * fVar9;
      __return_storage_ptr__->m[10] =
           fVar12 * o.m[0xe] + fVar11 * o.m[10] + fVar10 * o.m[2] + o.m[6] * fVar9;
      __return_storage_ptr__->m[0xb] =
           fVar12 * o.m[0xf] + fVar11 * o.m[0xb] + fVar10 * o.m[3] + fVar9 * o.m[7];
      __return_storage_ptr__->m[0xc] =
           o.m[0xc] * fVar16 + o.m[8] * fVar15 + o.m[0] * fVar14 + o.m[4] * fVar13;
      __return_storage_ptr__->m[0xd] =
           o.m[0xd] * fVar16 + o.m[9] * fVar15 + o.m[1] * fVar14 + o.m[5] * fVar13;
      __return_storage_ptr__->m[0xe] =
           o.m[0xe] * fVar16 + o.m[10] * fVar15 + o.m[2] * fVar14 + o.m[6] * fVar13;
      __return_storage_ptr__->m[0xf] =
           fVar16 * o.m[0xf] + fVar15 * o.m[0xb] + fVar14 * o.m[3] + o.m[7] * fVar13;
      uVar17 = o.type | uVar17;
    }
  }
  __return_storage_ptr__->type = uVar17;
  return __return_storage_ptr__;
}

Assistant:

mat4 operator*(mat4 o) const {

        if (type == Translation2D && o.type == Translation2D) {
            return mat4(1, 0, 0, m[3]+o.m[3],
                        0, 1, 0, m[7]+o.m[7],
                        0, 0, 1, 0,
                        0, 0, 0, 1,
                        Translation2D);

        } else if (type == Translation2D) {
            return mat4(o.m[ 0] + m[ 3] * o.m[12],
                        o.m[ 1] + m[ 3] * o.m[13],
                        o.m[ 2] + m[ 3] * o.m[14],
                        o.m[ 3] + m[ 3] * o.m[15],
                        o.m[ 4] + m[ 7] * o.m[12],
                        o.m[ 5] + m[ 7] * o.m[13],
                        o.m[ 6] + m[ 7] * o.m[14],
                        o.m[ 7] + m[ 7] * o.m[15],
                        o.m[ 8],
                        o.m[ 9],
                        o.m[10],
                        o.m[11],
                        o.m[12],
                        o.m[13],
                        o.m[14],
                        o.m[15],
                        type | o.type);

        } else if (o.type == Translation2D) {
            return mat4(m[ 0], m[ 1], m[ 2], m[ 0] * o.m[3] + m[ 1] * o.m[7] + m[ 3],
                        m[ 4], m[ 5], m[ 6], m[ 4] * o.m[3] + m[ 5] * o.m[7] + m[ 7],
                        m[ 8], m[ 9], m[10], m[ 8] * o.m[3] + m[ 9] * o.m[7] + m[11],
                        m[12], m[13], m[14], m[12] * o.m[3] + m[13] * o.m[7] + m[15],
                        Type(type | o.type));

        } else if (type <= ScaleAndRotate2D && o.type <= ScaleAndRotate2D) {
            return mat4(m[ 0] * o.m[0] + m[ 1] * o.m[4],
                        m[ 0] * o.m[1] + m[ 1] * o.m[5],
                        0,
                        m[ 0] * o.m[3] + m[ 1] * o.m[7] + m[ 3],

                        m[ 4] * o.m[0] + m[ 5] * o.m[4],
                        m[ 4] * o.m[1] + m[ 5] * o.m[5],
                        0,
                        m[ 4] * o.m[3] + m[ 5] * o.m[7] + m[ 7],

                        0, 0, 1, 0,
                        0, 0, 0, 1,
                        Type(type | o.type)) ;
            }

        // Genereic full multiplication
        return mat4(m[ 0] * o.m[0] + m[ 1] * o.m[4] + m[ 2] * o.m[ 8] + m[ 3] * o.m[12],
                    m[ 0] * o.m[1] + m[ 1] * o.m[5] + m[ 2] * o.m[ 9] + m[ 3] * o.m[13],
                    m[ 0] * o.m[2] + m[ 1] * o.m[6] + m[ 2] * o.m[10] + m[ 3] * o.m[14],
                    m[ 0] * o.m[3] + m[ 1] * o.m[7] + m[ 2] * o.m[11] + m[ 3] * o.m[15],

                    m[ 4] * o.m[0] + m[ 5] * o.m[4] + m[ 6] * o.m[ 8] + m[ 7] * o.m[12],
                    m[ 4] * o.m[1] + m[ 5] * o.m[5] + m[ 6] * o.m[ 9] + m[ 7] * o.m[13],
                    m[ 4] * o.m[2] + m[ 5] * o.m[6] + m[ 6] * o.m[10] + m[ 7] * o.m[14],
                    m[ 4] * o.m[3] + m[ 5] * o.m[7] + m[ 6] * o.m[11] + m[ 7] * o.m[15],

                    m[ 8] * o.m[0] + m[ 9] * o.m[4] + m[10] * o.m[ 8] + m[11] * o.m[12],
                    m[ 8] * o.m[1] + m[ 9] * o.m[5] + m[10] * o.m[ 9] + m[11] * o.m[13],
                    m[ 8] * o.m[2] + m[ 9] * o.m[6] + m[10] * o.m[10] + m[11] * o.m[14],
                    m[ 8] * o.m[3] + m[ 9] * o.m[7] + m[10] * o.m[11] + m[11] * o.m[15],

                    m[12] * o.m[0] + m[13] * o.m[4] + m[14] * o.m[ 8] + m[15] * o.m[12],
                    m[12] * o.m[1] + m[13] * o.m[5] + m[14] * o.m[ 9] + m[15] * o.m[13],
                    m[12] * o.m[2] + m[13] * o.m[6] + m[14] * o.m[10] + m[15] * o.m[14],
                    m[12] * o.m[3] + m[13] * o.m[7] + m[14] * o.m[11] + m[15] * o.m[15],
                    Type(type | o.type)) ;
    }